

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O2

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectMesh(CXMeshFileLoader *this,SXMesh *mesh)

{
  uint uVar1;
  array<unsigned_int> *this_00;
  array<irr::core::vector2d<float>_> *this_01;
  uint *puVar2;
  pointer pSVar3;
  pointer puVar4;
  short sVar5;
  short sVar6;
  ushort uVar7;
  bool bVar8;
  u32 uVar9;
  u32 uVar10;
  u32 uVar11;
  u32 uVar12;
  float fVar13;
  vector2d<float> *pvVar14;
  void *pvVar15;
  short sVar16;
  u32 type;
  char *this_02;
  u32 j;
  long lVar17;
  ulong uVar18;
  ushort uVar19;
  uint uVar20;
  array<irr::video::S3DVertex> *this_03;
  void *pvVar21;
  vector2d<float> *element;
  u32 f;
  ulong uVar22;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar23;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar24;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  short local_fc;
  ushort local_fa;
  ushort local_e8;
  ushort local_d8;
  short local_d0;
  string<char> local_c0;
  stringc objectName;
  array<unsigned_int> polygonfaces;
  stringc name;
  
  name.str._M_dataplus._M_p = (pointer)&name.str.field_2;
  name.str._M_string_length = 0;
  name.str.field_2._M_local_buf[0] = '\0';
  bVar8 = readHeadOfDataObject(this,&name);
  if (!bVar8) {
    os::Printer::log((Printer *)"No opening brace in Mesh found in x file",
                     (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    core::string<char>::string((string<char> *)&polygonfaces,this->Line);
    os::Printer::log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    ::std::__cxx11::string::_M_dispose();
    this->ErrorState = true;
    bVar8 = false;
    goto LAB_001ddfb5;
  }
  uVar9 = readInt(this);
  this_03 = &mesh->Vertices;
  ::std::vector<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>::resize
            ((vector<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_> *)this_03,
             (ulong)uVar9);
  for (lVar17 = 0; (ulong)uVar9 * 0x24 - lVar17 != 0; lVar17 = lVar17 + 0x24) {
    readVector3(this,(vector3df *)
                     ((long)&((this_03->m_data).
                              super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                              ._M_impl.super__Vector_impl_data._M_start)->Pos + lVar17));
    pSVar3 = (this_03->m_data).
             super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pSVar3->Normal + lVar17) = 0;
    *(undefined8 *)((long)&pSVar3->Normal + lVar17 + 8U) = 0xffffffff00000000;
  }
  bVar8 = checkForTwoFollowingSemicolons(this);
  if (!bVar8) {
    os::Printer::log((Printer *)"No finishing semicolon in Mesh Vertex Array found in x file",
                     (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
    core::string<char>::string((string<char> *)&polygonfaces,this->Line);
    os::Printer::log((double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
    ::std::__cxx11::string::_M_dispose();
  }
  uVar9 = readInt(this);
  this_00 = &mesh->Indices;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this_00->m_data,(ulong)(uVar9 * 3));
  ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&(mesh->IndexCountPerFace).m_data,(ulong)uVar9);
  uVar23 = 0;
  uVar24 = 0;
  polygonfaces.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  polygonfaces.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  polygonfaces.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  polygonfaces.is_sorted = true;
  uVar20 = 0;
  for (uVar18 = 0; uVar18 != uVar9; uVar18 = uVar18 + 1) {
    uVar10 = readInt(this);
    if (uVar10 == 3) {
      uVar10 = readInt(this);
      (this_00->m_data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar20] = uVar10;
      uVar10 = readInt(this);
      uVar1 = uVar20 + 2;
      (this_00->m_data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar20 + 1] = uVar10;
      uVar10 = readInt(this);
      uVar20 = uVar20 + 3;
      (this_00->m_data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar1] = uVar10;
      (mesh->IndexCountPerFace).m_data.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[uVar18] = 3;
      uVar23 = extraout_XMM0_Da_04;
      uVar24 = extraout_XMM0_Db_04;
    }
    else {
      if (uVar10 < 3) {
        os::Printer::log((Printer *)"Invalid face count (<3) found in Mesh x file reader.",
                         (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
        core::string<char>::string(&objectName,this->Line);
        os::Printer::log((double)CONCAT44(extraout_XMM0_Db_19,extraout_XMM0_Da_19));
        ::std::__cxx11::string::_M_dispose();
        goto LAB_001ddf58;
      }
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&polygonfaces.m_data,(ulong)uVar10);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this_00->m_data,
                 (ulong)(((int)((ulong)((long)(mesh->Indices).m_data.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(mesh->Indices).m_data.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2) +
                         uVar10 * 3) - 9));
      (mesh->IndexCountPerFace).m_data.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[uVar18] = (short)uVar10 * 3 - 6;
      uVar23 = extraout_XMM0_Da_05;
      uVar24 = extraout_XMM0_Db_05;
      for (uVar22 = 0; uVar10 != uVar22; uVar22 = uVar22 + 1) {
        uVar11 = readInt(this);
        polygonfaces.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar22] = uVar11;
        uVar23 = extraout_XMM0_Da_06;
        uVar24 = extraout_XMM0_Db_06;
      }
      puVar4 = (this_00->m_data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (lVar17 = 2; lVar17 - (ulong)(uVar10 - 2) != 2; lVar17 = lVar17 + 1) {
        puVar4[uVar20] =
             *polygonfaces.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
        uVar1 = uVar20 + 2;
        puVar4[uVar20 + 1] =
             polygonfaces.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar17 + -1];
        uVar20 = uVar20 + 3;
        puVar4[uVar1] =
             polygonfaces.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar17];
      }
    }
  }
  puVar4 = (mesh->Indices).m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar18 = 0;
  do {
    if (((ulong)((long)(mesh->Indices).m_data.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar4) >> 2 & 0xffffffff) ==
        uVar18) {
      bVar8 = checkForTwoFollowingSemicolons(this);
      if (!bVar8) {
        os::Printer::log((Printer *)"No finishing semicolon in Mesh Face Array found in x file",
                         (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
        core::string<char>::string(&objectName,this->Line);
        os::Printer::log((double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
        ::std::__cxx11::string::_M_dispose();
      }
      this_01 = &mesh->TCoords2;
      goto LAB_001dd9ac;
    }
    puVar2 = puVar4 + uVar18;
    uVar18 = uVar18 + 1;
  } while (*puVar2 < (uint)(((long)(mesh->Vertices).m_data.
                                   super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(mesh->Vertices).m_data.
                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x24));
  os::Printer::log((Printer *)"Out of range index found in Mesh x file reader.",
                   (double)CONCAT44(uVar24,uVar23));
LAB_001ddf58:
  this->ErrorState = true;
  goto LAB_001ddfa6;
LAB_001dd9ac:
  getNextToken(&objectName,this);
  if ((int)objectName.str._M_string_length == 0) goto LAB_001ddf5e;
  bVar8 = core::string<char>::operator==(&objectName,"}");
  if (bVar8) {
    ::std::__cxx11::string::_M_dispose();
    bVar8 = true;
    goto LAB_001ddfa8;
  }
  bVar8 = core::string<char>::operator==(&objectName,"MeshNormals");
  if (bVar8) {
    bVar8 = parseDataObjectMeshNormals(this,mesh);
LAB_001dda68:
    if (bVar8 == false) goto LAB_001ddf9c;
  }
  else {
    bVar8 = core::string<char>::operator==(&objectName,"MeshTextureCoords");
    if (bVar8) {
      bVar8 = parseDataObjectMeshTextureCoords(this,mesh);
      goto LAB_001dda68;
    }
    bVar8 = core::string<char>::operator==(&objectName,"MeshVertexColors");
    if (bVar8) {
      bVar8 = parseDataObjectMeshVertexColors(this,mesh);
      goto LAB_001dda68;
    }
    bVar8 = core::string<char>::operator==(&objectName,"MeshMaterialList");
    if (bVar8) {
      bVar8 = parseDataObjectMeshMaterialList(this,mesh);
      goto LAB_001dda68;
    }
    bVar8 = core::string<char>::operator==(&objectName,"VertexDuplicationIndices");
    if (bVar8) {
LAB_001dda60:
      bVar8 = parseUnknownDataObject(this);
      goto LAB_001dda68;
    }
    bVar8 = core::string<char>::operator==(&objectName,"DeclData");
    if (bVar8) {
      bVar8 = readHeadOfDataObject(this,(stringc *)0x0);
      if (!bVar8) {
        this_02 = "No starting brace in DeclData found.";
        uVar23 = extraout_XMM0_Da_10;
        uVar24 = extraout_XMM0_Db_10;
        goto LAB_001ddf65;
      }
      uVar9 = readInt(this);
      local_e8 = 0xffff;
      uVar19 = 0;
      local_fa = 0xffff;
      local_d8 = 0xffff;
      local_d0 = -1;
      local_fc = -1;
      sVar6 = -1;
      while( true ) {
        uVar10 = readInt(this);
        uVar18 = (ulong)uVar10;
        bVar8 = uVar9 == 0;
        uVar9 = uVar9 - 1;
        if (bVar8) break;
        readInt(this);
        uVar11 = readInt(this);
        uVar12 = readInt(this);
        sVar16 = (short)uVar10;
        uVar7 = local_d8;
        sVar5 = sVar6;
        if (uVar11 == 5) {
          uVar7 = uVar19;
          sVar5 = sVar16;
          if ((uVar12 != 1) && (uVar7 = local_d8, sVar5 = sVar6, uVar12 == 0)) {
            local_fc = sVar16;
            local_fa = uVar19;
          }
        }
        else if (uVar11 == 3) {
          local_e8 = uVar19;
          local_d0 = sVar16;
        }
        local_d8 = uVar7;
        sVar6 = sVar5;
        switch(uVar18) {
        case 0:
        case 4:
        case 5:
        case 6:
        case 8:
        case 9:
        case 0xb:
        case 0xd:
        case 0xe:
        case 0xf:
          uVar19 = uVar19 + 4;
          break;
        case 1:
        case 7:
        case 10:
        case 0xc:
        case 0x10:
          uVar19 = uVar19 + 8;
          break;
        case 2:
          uVar19 = uVar19 + 0xc;
          break;
        case 3:
          uVar19 = uVar19 + 0x10;
        }
      }
      pvVar15 = operator_new__(uVar18 * 4);
      for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
        uVar9 = readInt(this);
        *(u32 *)((long)pvVar15 + uVar22 * 4) = uVar9;
      }
      bVar8 = checkForOneFollowingSemicolons(this);
      if (!bVar8) {
        os::Printer::log((Printer *)"No finishing semicolon in DeclData found.",
                         (double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12));
        core::string<char>::string(&local_c0,this->Line);
        os::Printer::log((double)CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13));
        ::std::__cxx11::string::_M_dispose();
      }
      bVar8 = checkForClosingBrace(this);
      if (!bVar8) {
        os::Printer::log((Printer *)"No closing brace in DeclData.",
                         (double)CONCAT44(extraout_XMM0_Db_14,extraout_XMM0_Da_14));
        core::string<char>::string(&local_c0,this->Line);
        os::Printer::log((double)CONCAT44(extraout_XMM0_Db_21,extraout_XMM0_Da_21));
        ::std::__cxx11::string::_M_dispose();
        operator_delete__(pvVar15);
        goto LAB_001ddf98;
      }
      if (sVar6 == 1 && local_d8 != 0xffff) {
        core::array<irr::core::vector2d<float>_>::reallocate
                  (this_01,(u32)(((long)(mesh->Vertices).m_data.
                                        super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(mesh->Vertices).m_data.
                                       super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0x24),true);
      }
      lVar17 = 0x1c;
      pvVar21 = pvVar15;
      for (uVar18 = 0;
          pSVar3 = (mesh->Vertices).m_data.
                   super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar18 < (((long)(mesh->Vertices).m_data.
                           super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) / 0x24 &
                   0xffffffffU); uVar18 = uVar18 + 1) {
        if (local_d0 == 2 && local_e8 != 0xffff) {
          *(undefined8 *)((long)pSVar3 + lVar17 + -0x10) =
               *(undefined8 *)((long)pvVar21 + (long)(short)local_e8);
          *(undefined4 *)((long)pSVar3 + lVar17 + -8) =
               *(undefined4 *)((long)pvVar21 + (long)(short)local_e8 + 8);
        }
        if (local_fc == 1 && local_fa != 0xffff) {
          *(undefined8 *)((long)&(pSVar3->Pos).X + lVar17) =
               *(undefined8 *)((long)pvVar21 + (long)(short)local_fa);
        }
        if (sVar6 == 1 && local_d8 != 0xffff) {
          core::array<irr::core::vector2d<float>_>::push_back
                    (this_01,(vector2d<float> *)((long)pvVar21 + (long)(short)local_d8));
        }
        pvVar21 = (void *)((long)pvVar21 + (ulong)uVar19);
        lVar17 = lVar17 + 0x24;
      }
      operator_delete__(pvVar15);
    }
    else {
      bVar8 = core::string<char>::operator==(&objectName,"FVFData");
      if (!bVar8) {
        bVar8 = core::string<char>::operator==(&objectName,"XSkinMeshHeader");
        if (bVar8) {
          bVar8 = parseDataObjectSkinMeshHeader(this,mesh);
        }
        else {
          bVar8 = core::string<char>::operator==(&objectName,"SkinWeights");
          if (!bVar8) {
            os::Printer::log((double)CONCAT44(extraout_XMM0_Db_18,extraout_XMM0_Da_18));
            goto LAB_001dda60;
          }
          bVar8 = parseDataObjectSkinWeights(this,mesh);
        }
        goto LAB_001dda68;
      }
      bVar8 = readHeadOfDataObject(this,(stringc *)0x0);
      if (!bVar8) {
        this_02 = "No starting brace in FVFData found.";
        uVar23 = extraout_XMM0_Da_11;
        uVar24 = extraout_XMM0_Db_11;
        goto LAB_001ddf65;
      }
      uVar9 = readInt(this);
      uVar10 = readInt(this);
      pvVar14 = (vector2d<float> *)operator_new__((ulong)uVar10 * 4);
      for (uVar18 = 0; uVar10 != uVar18; uVar18 = uVar18 + 1) {
        fVar13 = (float)readInt(this);
        (&pvVar14->X)[uVar18] = fVar13;
      }
      if ((uVar9 & 0x102) != 0) {
        core::array<irr::core::vector2d<float>_>::reallocate
                  (this_01,(u32)(((long)(mesh->Vertices).m_data.
                                        super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(mesh->Vertices).m_data.
                                       super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0x24),true);
        element = pvVar14;
        for (uVar20 = 0;
            uVar20 < (uint)(((long)(mesh->Vertices).m_data.
                                   super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(mesh->Vertices).m_data.
                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x24);
            uVar20 = uVar20 + 1) {
          core::array<irr::core::vector2d<float>_>::push_back(this_01,element);
          element = (vector2d<float> *)((long)&element->X + (ulong)(uVar9 >> 5 & 0x78));
        }
      }
      operator_delete__(pvVar14);
      bVar8 = checkForOneFollowingSemicolons(this);
      if (!bVar8) {
        os::Printer::log((Printer *)"No finishing semicolon in FVFData found.",
                         (double)CONCAT44(extraout_XMM0_Db_15,extraout_XMM0_Da_15));
        core::string<char>::string(&local_c0,this->Line);
        os::Printer::log((double)CONCAT44(extraout_XMM0_Db_16,extraout_XMM0_Da_16));
        ::std::__cxx11::string::_M_dispose();
      }
      bVar8 = checkForClosingBrace(this);
      if (!bVar8) {
        this_02 = "No closing brace in FVFData found in x file";
        uVar23 = extraout_XMM0_Da_17;
        uVar24 = extraout_XMM0_Db_17;
        goto LAB_001ddf65;
      }
    }
  }
  ::std::__cxx11::string::_M_dispose();
  goto LAB_001dd9ac;
LAB_001ddf5e:
  this_02 = "Unexpected ending found in Mesh in x file.";
  uVar23 = extraout_XMM0_Da_09;
  uVar24 = extraout_XMM0_Db_09;
LAB_001ddf65:
  os::Printer::log((Printer *)this_02,(double)CONCAT44(uVar24,uVar23));
  core::string<char>::string(&local_c0,this->Line);
  os::Printer::log((double)CONCAT44(extraout_XMM0_Db_20,extraout_XMM0_Da_20));
  ::std::__cxx11::string::_M_dispose();
LAB_001ddf98:
  this->ErrorState = true;
LAB_001ddf9c:
  ::std::__cxx11::string::_M_dispose();
LAB_001ddfa6:
  bVar8 = false;
LAB_001ddfa8:
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&polygonfaces);
LAB_001ddfb5:
  ::std::__cxx11::string::_M_dispose();
  return bVar8;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectMesh(SXMesh &mesh)
{
	core::stringc name;

	if (!readHeadOfDataObject(&name)) {
#ifdef _XREADER_DEBUG
		os::Printer::log("CXFileReader: Reading mesh", ELL_DEBUG);
#endif
		os::Printer::log("No opening brace in Mesh found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: Reading mesh", name.c_str(), ELL_DEBUG);
#endif

	// read vertex count
	const u32 nVertices = readInt();

	// read vertices
	mesh.Vertices.set_used(nVertices);
	for (u32 n = 0; n < nVertices; ++n) {
		readVector3(mesh.Vertices[n].Pos);
		mesh.Vertices[n].Color = 0xFFFFFFFF;
		mesh.Vertices[n].Normal = core::vector3df(0.0f);
	}

	if (!checkForTwoFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Vertex Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	// read faces
	const u32 nFaces = readInt();

	mesh.Indices.set_used(nFaces * 3);
	mesh.IndexCountPerFace.set_used(nFaces);

	core::array<u32> polygonfaces;
	u32 currentIndex = 0;

	for (u32 k = 0; k < nFaces; ++k) {
		const u32 fcnt = readInt();

		if (fcnt != 3) {
			if (fcnt < 3) {
				os::Printer::log("Invalid face count (<3) found in Mesh x file reader.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}

			// read face indices
			polygonfaces.set_used(fcnt);
			u32 triangles = (fcnt - 2);
			mesh.Indices.set_used(mesh.Indices.size() + ((triangles - 1) * 3));
			mesh.IndexCountPerFace[k] = (u16)(triangles * 3);

			for (u32 f = 0; f < fcnt; ++f)
				polygonfaces[f] = readInt();

			for (u32 jk = 0; jk < triangles; ++jk) {
				mesh.Indices[currentIndex++] = polygonfaces[0];
				mesh.Indices[currentIndex++] = polygonfaces[jk + 1];
				mesh.Indices[currentIndex++] = polygonfaces[jk + 2];
			}

			// TODO: change face indices in material list
		} else {
			mesh.Indices[currentIndex++] = readInt();
			mesh.Indices[currentIndex++] = readInt();
			mesh.Indices[currentIndex++] = readInt();
			mesh.IndexCountPerFace[k] = 3;
		}
	}

	for (u32 j = 0; j < mesh.Indices.size(); j++) {
		if (mesh.Indices[j] >= mesh.Vertices.size()) {
			os::Printer::log("Out of range index found in Mesh x file reader.", ELL_WARNING);
			SET_ERR_AND_RETURN();
		}
	}

	if (!checkForTwoFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Face Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	// here, other data objects may follow

	while (true) {
		core::stringc objectName = getNextToken();

		if (objectName.size() == 0) {
			os::Printer::log("Unexpected ending found in Mesh in x file.", ELL_WARNING);
			os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			SET_ERR_AND_RETURN();
		} else if (objectName == "}") {
			break; // mesh finished
		}

#ifdef _XREADER_DEBUG
		os::Printer::log("debug DataObject in mesh", objectName.c_str(), ELL_DEBUG);
#endif

		if (objectName == "MeshNormals") {
			if (!parseDataObjectMeshNormals(mesh))
				return false;
		} else if (objectName == "MeshTextureCoords") {
			if (!parseDataObjectMeshTextureCoords(mesh))
				return false;
		} else if (objectName == "MeshVertexColors") {
			if (!parseDataObjectMeshVertexColors(mesh))
				return false;
		} else if (objectName == "MeshMaterialList") {
			if (!parseDataObjectMeshMaterialList(mesh))
				return false;
		} else if (objectName == "VertexDuplicationIndices") {
			// we'll ignore vertex duplication indices
			// TODO: read them
			if (!parseUnknownDataObject())
				return false;
		} else if (objectName == "DeclData") {
			if (!readHeadOfDataObject()) {
				os::Printer::log("No starting brace in DeclData found.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}
			// arbitrary vertex attributes
			// first comes the number of element definitions
			// then the vertex element type definitions
			// with format type;tesselator;semantics;usageindex
			// we want to support 2;0;6;0 == tangent
			//                    2;0;7;0 == binormal
			//                    2;0;3;0 == normal
			//                  1/2;0;5;0 == 1st uv coord
			// and              1/2;0;5;1 == 2nd uv coord
			// type==2 is 3xf32, type==1 is 2xf32
			u32 j;
			const u32 dcnt = readInt();
			u16 size = 0;
			s16 normalpos = -1;
			s16 uvpos = -1;
			s16 uv2pos = -1;
			s16 tangentpos = -1;
			s16 binormalpos = -1;
			s16 normaltype = -1;
			s16 uvtype = -1;
			s16 uv2type = -1;
			s16 tangenttype = -1;
			s16 binormaltype = -1;

			(void)tangentpos;   // disable unused variable warnings
			(void)binormalpos;  // disable unused variable warnings
			(void)tangenttype;  // disable unused variable warnings
			(void)binormaltype; // disable unused variable warnings

			for (j = 0; j < dcnt; ++j) {
				const u32 type = readInt();
				// const u32 tesselator = readInt();
				readInt();
				const u32 semantics = readInt();
				const u32 index = readInt();
				switch (semantics) {
				case 3:
					normalpos = size;
					normaltype = type;
					break;
				case 5:
					if (index == 0) {
						uvpos = size;
						uvtype = type;
					} else if (index == 1) {
						uv2pos = size;
						uv2type = type;
					}
					break;
				case 6:
					tangentpos = size;
					tangenttype = type;
					break;
				case 7:
					binormalpos = size;
					binormaltype = type;
					break;
				default:
					break;
				}
				switch (type) {
				case 0:
					size += 4;
					break;
				case 1:
					size += 8;
					break;
				case 2:
					size += 12;
					break;
				case 3:
					size += 16;
					break;
				case 4:
				case 5:
				case 6:
					size += 4;
					break;
				case 7:
					size += 8;
					break;
				case 8:
				case 9:
					size += 4;
					break;
				case 10:
					size += 8;
					break;
				case 11:
					size += 4;
					break;
				case 12:
					size += 8;
					break;
				case 13:
					size += 4;
					break;
				case 14:
					size += 4;
					break;
				case 15:
					size += 4;
					break;
				case 16:
					size += 8;
					break;
				}
			}
			const u32 datasize = readInt();
			u32 *data = new u32[datasize];
			for (j = 0; j < datasize; ++j)
				data[j] = readInt();

			if (!checkForOneFollowingSemicolons()) {
				os::Printer::log("No finishing semicolon in DeclData found.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			}
			if (!checkForClosingBrace()) {
				os::Printer::log("No closing brace in DeclData.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				delete[] data;
				SET_ERR_AND_RETURN();
			}
			u8 *dataptr = (u8 *)data;
			if ((uv2pos != -1) && (uv2type == 1))
				mesh.TCoords2.reallocate(mesh.Vertices.size());
			for (j = 0; j < mesh.Vertices.size(); ++j) {
				if ((normalpos != -1) && (normaltype == 2))
					mesh.Vertices[j].Normal.set(*((core::vector3df *)(dataptr + normalpos)));
				if ((uvpos != -1) && (uvtype == 1))
					mesh.Vertices[j].TCoords.set(*((core::vector2df *)(dataptr + uvpos)));
				if ((uv2pos != -1) && (uv2type == 1))
					mesh.TCoords2.push_back(*((core::vector2df *)(dataptr + uv2pos)));
				dataptr += size;
			}
			delete[] data;
		} else if (objectName == "FVFData") {
			if (!readHeadOfDataObject()) {
				os::Printer::log("No starting brace in FVFData found.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}
			const u32 dataformat = readInt();
			const u32 datasize = readInt();
			u32 *data = new u32[datasize];
			for (u32 j = 0; j < datasize; ++j)
				data[j] = readInt();
			if (dataformat & 0x102) { // 2nd uv set
				mesh.TCoords2.reallocate(mesh.Vertices.size());
				u8 *dataptr = (u8 *)data;
				const u32 size = ((dataformat >> 8) & 0xf) * sizeof(core::vector2df);
				for (u32 j = 0; j < mesh.Vertices.size(); ++j) {
					mesh.TCoords2.push_back(*((core::vector2df *)(dataptr)));
					dataptr += size;
				}
			}
			delete[] data;
			if (!checkForOneFollowingSemicolons()) {
				os::Printer::log("No finishing semicolon in FVFData found.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			}
			if (!checkForClosingBrace()) {
				os::Printer::log("No closing brace in FVFData found in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}
		} else if (objectName == "XSkinMeshHeader") {
			if (!parseDataObjectSkinMeshHeader(mesh))
				return false;
		} else if (objectName == "SkinWeights") {
			// mesh.SkinWeights.push_back(SXSkinWeight());
			// if (!parseDataObjectSkinWeights(mesh.SkinWeights.getLast()))
			if (!parseDataObjectSkinWeights(mesh))
				return false;
		} else {
			os::Printer::log("Unknown data object in mesh in x file", objectName.c_str(), ELL_WARNING);
			if (!parseUnknownDataObject())
				return false;
		}
	}

	return true;
}